

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hokuyo.h
# Opt level: O1

int DisconnectHokuyo(HOKUYO *pHokuyo)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  ssize_t sVar4;
  uint uVar5;
  ulong uVar6;
  char local_24 [4];
  
  sVar3 = strlen(local_24);
  iVar2 = (pHokuyo->RS232Port).DevType;
  uVar1 = (uint)sVar3;
  if (iVar2 - 1U < 4) {
    if (0 < (int)uVar1) {
      iVar2 = (pHokuyo->RS232Port).s;
      uVar6 = 0;
      do {
        sVar4 = send(iVar2,local_24 + uVar6,(long)(int)(uVar1 - (int)uVar6),0);
        if ((int)sVar4 < 1) goto LAB_001222c8;
        uVar5 = (int)uVar6 + (int)sVar4;
        uVar6 = (ulong)uVar5;
      } while ((int)uVar5 < (int)uVar1);
    }
  }
  else {
    if (iVar2 != 0) {
LAB_001222c8:
      puts("Error while disconnecting a Hokuyo.");
      CloseRS232Port(&pHokuyo->RS232Port);
      return 1;
    }
    if (uVar1 != 0) {
      iVar2 = *(int *)&(pHokuyo->RS232Port).hDev;
      uVar6 = 0;
      do {
        sVar4 = write(iVar2,local_24 + uVar6,(ulong)(uVar1 - (int)uVar6));
        if ((int)sVar4 < 1) goto LAB_001222c8;
        uVar5 = (int)uVar6 + (int)sVar4;
        uVar6 = (ulong)uVar5;
      } while (uVar5 < uVar1);
    }
  }
  iVar2 = CloseRS232Port(&pHokuyo->RS232Port);
  if (iVar2 != 0) {
    puts("Hokuyo disconnection failed.");
    return 1;
  }
  puts("Hokuyo disconnected.");
  return 0;
}

Assistant:

inline int DisconnectHokuyo(HOKUYO* pHokuyo)
{		
	char sendbuf[4];
	int sendbuflen = 0;
	//char recvbuf[9];
	//int recvbuflen = 0;

	// QT command to switch off the laser.

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	strcpy(sendbuf, "QT\n");
	sendbuflen = (int)strlen(sendbuf);

	if (WriteAllRS232Port(&pHokuyo->RS232Port, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		printf("Error while disconnecting a Hokuyo.\n");
		CloseRS232Port(&pHokuyo->RS232Port);
		return EXIT_FAILURE;
	}
	
	//// Prepare the buffers.
	//memset(recvbuf, 0, sizeof(recvbuf));
	//recvbuflen = 8;

	//if (ReadAllRS232Port(&pHokuyo->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
	//{
	//	printf("Error while disconnecting a Hokuyo.\n");
	//	CloseRS232Port(&pHokuyo->RS232Port);
	//	return EXIT_FAILURE;
	//}

	//// Check response.
	//if (strcmp(recvbuf, "QT\n00P\n\n") != 0)
	//{
	//	printf("Error while disconnecting a Hokuyo.\n");
	//	CloseRS232Port(&pHokuyo->RS232Port);
	//	return EXIT_FAILURE;
	//}

	if (CloseRS232Port(&pHokuyo->RS232Port) != EXIT_SUCCESS)
	{
		printf("Hokuyo disconnection failed.\n");
		return EXIT_FAILURE;
	}

	printf("Hokuyo disconnected.\n");

	return EXIT_SUCCESS;
}